

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O3

void FS_GiveInventory(AActor *actor,char *type,int amount)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  PClassActor *p;
  PClassInventory *pPVar2;
  char *name;
  
  if (amount < 1) {
    return;
  }
  iVar1 = strcmp(type,"Armor");
  name = "BasicArmorPickup";
  if (iVar1 != 0) {
    name = type;
  }
  p = PClass::FindActor(name);
  pPVar2 = dyn_cast<PClassInventory>((DObject *)p);
  if (pPVar2 != (PClassInventory *)0x0) {
    UNRECOVERED_JUMPTABLE = (actor->super_DThinker).super_DObject._vptr_DObject[0x1a];
    (*UNRECOVERED_JUMPTABLE)(actor,pPVar2,(ulong)(uint)amount,0,UNRECOVERED_JUMPTABLE);
    return;
  }
  Printf("Unknown inventory item: %s\n",name);
  return;
}

Assistant:

static void FS_GiveInventory (AActor *actor, const char * type, int amount)
{
	if (amount <= 0)
	{
		return;
	}
	if (strcmp (type, "Armor") == 0)
	{
		type = "BasicArmorPickup";
	}
	PClassInventory * info = dyn_cast<PClassInventory>(PClass::FindActor (type));
	if (info == NULL)
	{
		Printf ("Unknown inventory item: %s\n", type);
		return;
	}

	actor->GiveInventory(info, amount);
}